

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O3

void dropt_misuse(char *message,char *filename,int line)

{
  fprintf(_stderr,"dropt: %s (%s: %d)\n",message,filename,(ulong)(uint)line);
  abort();
}

Assistant:

void
dropt_misuse(const char* message, const char* filename, int line)
{
#ifdef NDEBUG
    fprintf(stderr, "dropt: %s\n", message);
#else
    fprintf(stderr, "dropt: %s (%s: %d)\n", message, filename, line);
    abort();
#endif
}